

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::NewClassExpression::fromSyntax
          (Compilation *comp,SuperNewDefaultedArgsExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  Symbol *pSVar1;
  SubroutineSymbol *sub;
  NewClassExpression *pNVar2;
  Expression *pEVar3;
  SourceLocation in_R9;
  SourceRange sourceRange;
  pair<const_slang::ast::ClassType_*,_bool> pVar4;
  SourceRange range_00;
  SourceRange range;
  not_null<const_slang::ast::Scope_*> local_60;
  ClassType *local_58;
  bool local_50 [8];
  SourceRange local_48;
  RandomizeDetails *local_38;
  
  local_60.ptr = (Scope *)assignmentTarget;
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  range_00.endLoc = in_R9;
  range_00.startLoc = sourceRange.endLoc;
  local_48 = sourceRange;
  pVar4 = resolveNewClassTarget
                    ((ast *)(syntax->scopedNew).ptr,(NameSyntax *)context,(ASTContext *)&local_60,
                     (Type **)sourceRange.startLoc,range_00);
  local_58 = pVar4.first;
  local_50[0] = pVar4.second;
  if (local_58 != (ClassType *)0x0) {
    pSVar1 = ((context->scope).ptr)->thisSym;
    if ((pSVar1->kind == Subroutine) && ((pSVar1[3].field_0x5 & 0x10) == 0)) {
      ASTContext::addDiag(context,(DiagCode)0x670007,sourceRange);
    }
    local_38 = (RandomizeDetails *)0x0;
    pNVar2 = BumpAllocator::
             emplace<slang::ast::NewClassExpression,slang::ast::Type_const&,decltype(nullptr),bool&,slang::SourceRange&>
                       (&comp->super_BumpAllocator,(Type *)local_60.ptr,&local_38,local_50,&local_48
                       );
    return &pNVar2->super_Expression;
  }
  pEVar3 = Expression::badExpr(comp,(Expression *)0x0);
  return pEVar3;
}

Assistant:

Expression& NewClassExpression::fromSyntax(Compilation& comp,
                                           const SuperNewDefaultedArgsExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();
    auto [classType, isSuperClass] = resolveNewClassTarget(*syntax.scopedNew, context,
                                                           assignmentTarget, range);
    if (!classType)
        return badExpr(comp, nullptr);

    SLANG_ASSERT(isSuperClass);

    // The containing constructor (should be our parent scope)
    // must have a 'default' argument as well.
    if (context.scope->asSymbol().kind == SymbolKind::Subroutine) {
        auto& sub = context.scope->asSymbol().as<SubroutineSymbol>();
        if (!sub.flags.has(MethodFlags::DefaultedSuperArg))
            context.addDiag(diag::InvalidSuperNewDefault, range);
    }

    return *comp.emplace<NewClassExpression>(*assignmentTarget, nullptr, isSuperClass, range);
}